

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

D_ParseNode * dparse(D_Parser *ap,char *buf,int buf_len)

{
  uint32 *puVar1;
  uint uVar2;
  SNode *pSVar3;
  ZNode *pZVar4;
  PNode *pPVar5;
  PNode *pPVar6;
  int iVar7;
  Parser *pPVar8;
  D_Scope *pDVar9;
  PNode *pPVar10;
  PNode *pn;
  D_Parser *ap_00;
  PNode *pPVar11;
  ulong uVar12;
  D_ParseNode *pDVar13;
  PNode *_t;
  ZNode *local_40;
  PNode *local_38;
  
  *(undefined4 *)&ap[1].syntax_error_fn = 0;
  ap[1].ambiguity_fn = (D_AmbiguityFn)0x0;
  ap[1].free_node_fn = (D_FreeNodeFn)0x0;
  ap[1].initial_globals = buf;
  ap[1].initial_white_space_fn = (D_WhiteSpaceFn)(buf + buf_len);
  if (*(int *)&(ap[1].initial_scope)->updates != 0) {
    pPVar8 = new_subparser((Parser *)ap);
    ap[3].initial_scope = (D_Scope *)pPVar8;
    (pPVar8->user).initial_white_space_fn = null_white_space;
    (pPVar8->user).error_recovery = 0;
    (pPVar8->user).partial_parses = 1;
    (pPVar8->user).free_node_fn = ap->free_node_fn;
  }
  alloc_parser_working_data((Parser *)ap);
  if (ap->initial_scope == (D_Scope *)0x0) {
    if ((D_Scope *)ap[2].initial_white_space_fn != (D_Scope *)0x0) {
      free_D_Scope((D_Scope *)ap[2].initial_white_space_fn,0);
    }
    pDVar9 = new_D_Scope((D_Scope *)0x0);
    ap[2].initial_white_space_fn = (D_WhiteSpaceFn)pDVar9;
    *(byte *)pDVar9 = *(byte *)pDVar9 | 3;
  }
  else {
    ap[2].initial_white_space_fn = (D_WhiteSpaceFn)ap->initial_scope;
  }
  iVar7 = exhaustive_parse((Parser *)ap,ap->start_state);
  pSVar3 = (SNode *)ap[2].initial_scope;
  if (iVar7 == 0) {
    uVar2 = (pSVar3->zns).n;
    if (uVar2 == 0) {
      local_40 = (ZNode *)0x0;
      pPVar10 = (PNode *)0x0;
LAB_0014650b:
      *(pSVar3->zns).v = local_40;
      (pSVar3->zns).n = 1;
      (pSVar3->zns).i = 0;
    }
    else {
      if (uVar2 != 1) {
        uVar12 = 0;
        local_38 = (PNode *)0x0;
        local_40 = (ZNode *)0x0;
        pPVar11 = (PNode *)0x0;
        do {
          pZVar4 = (pSVar3->zns).v[uVar12];
          pPVar10 = pPVar11;
          if (pZVar4 != (ZNode *)0x0) {
            pPVar5 = pZVar4->pn;
            pPVar10 = pPVar5->latest;
            pPVar6 = pPVar10->latest;
            pn = pPVar10;
            if (pPVar10 != pPVar10->latest) {
              do {
                pPVar10 = pPVar6;
                pPVar10->refcount = pPVar10->refcount + 1;
                puVar1 = &pn->refcount;
                *puVar1 = *puVar1 - 1;
                if (*puVar1 == 0) {
                  free_PNode((Parser *)ap,pn);
                }
                pPVar5->latest = pPVar10;
                pPVar6 = pPVar10->latest;
                pn = pPVar10;
              } while (pPVar10 != pPVar10->latest);
            }
            if (pPVar11 == (PNode *)0x0) {
              local_40 = (pSVar3->zns).v[uVar12];
            }
            else {
              if (((pPVar10 != pPVar11) && (pPVar10->ambiguities == (PNode *)0x0)) &&
                 (pPVar10 != local_38)) {
                pPVar10->ambiguities = pPVar11->ambiguities;
                pPVar10->refcount = pPVar10->refcount + 1;
                pPVar11->ambiguities = pPVar10;
                if (local_38 == (PNode *)0x0) {
                  local_38 = pPVar10;
                }
              }
              free_ZNode((Parser *)ap,(pSVar3->zns).v[uVar12],pSVar3);
              pPVar10 = pPVar11;
            }
          }
          uVar12 = uVar12 + 1;
          pPVar11 = pPVar10;
        } while (uVar12 < (pSVar3->zns).n);
        goto LAB_0014650b;
      }
      pPVar10 = (*(pSVar3->zns).v)->pn;
    }
    pPVar10 = commit_tree((Parser *)ap,pPVar10);
    if (pPVar10 == (PNode *)0x0) {
      free_parser_working_data((Parser *)ap);
      ap_00 = (D_Parser *)ap[3].initial_scope;
      pDVar13 = (D_ParseNode *)0x0;
      goto LAB_001465ff;
    }
    if ((d_verbose_level != 0) &&
       (printf("%d states %d scans %d shifts %d reductions %d compares %d ambiguities\n",
               (ulong)*(uint *)&ap[1].syntax_error_fn,(ulong)*(uint *)&ap[1].ambiguity_fn,
               (ulong)*(uint *)((long)&ap[1].ambiguity_fn + 4),(ulong)*(uint *)&ap[1].free_node_fn,
               (ulong)*(uint *)((long)&ap[1].free_node_fn + 4),*(undefined4 *)&ap[1].loc.s),
       ap->save_parse_tree != 0)) {
      if (d_verbose_level < 2) {
        print_paren((Parser *)ap,pPVar10);
      }
      else {
        xprint_paren((Parser *)ap,pPVar10);
      }
      putchar(10);
    }
    if (ap->save_parse_tree == 0) {
      pDVar13 = (D_ParseNode *)0x1;
    }
    else {
      pPVar10->refcount = pPVar10->refcount + 1;
      pDVar13 = &pPVar10->parse_node;
    }
    pSVar3 = (SNode *)ap[2].initial_scope;
    puVar1 = &pSVar3->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_SNode((Parser *)ap,pSVar3);
    }
LAB_001465e5:
    ap[2].initial_scope = (D_Scope *)0x0;
  }
  else {
    if (pSVar3 != (SNode *)0x0) {
      puVar1 = &pSVar3->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_SNode((Parser *)ap,pSVar3);
      }
      pDVar13 = (D_ParseNode *)0x0;
      goto LAB_001465e5;
    }
    pDVar13 = (D_ParseNode *)0x0;
  }
  free_parser_working_data((Parser *)ap);
  ap_00 = (D_Parser *)ap[3].initial_scope;
LAB_001465ff:
  if (ap_00 != (D_Parser *)0x0) {
    free_D_Parser(ap_00);
    ap[3].initial_scope = (D_Scope *)0x0;
  }
  return pDVar13;
}

Assistant:

D_ParseNode *dparse(D_Parser *ap, char *buf, int buf_len) {
  uint r;
  Parser *p = (Parser *)ap;
  SNode *sn;
  PNode *pn;
  D_ParseNode *res = NULL;

  p->states = p->scans = p->shifts = p->reductions = p->compares = 0;
  p->start = buf;
  p->end = buf + buf_len;

  initialize_whitespace_parser(p);
  alloc_parser_working_data(p);
  if (p->user.initial_scope)
    p->top_scope = p->user.initial_scope;
  else {
    if (p->top_scope) free_D_Scope(p->top_scope, 0);
    p->top_scope = new_D_Scope(NULL);
    p->top_scope->kind = D_SCOPE_SEQUENTIAL;
  }
  r = exhaustive_parse(p, p->user.start_state);
  if (!r) {
    sn = p->accept;
    if (sn->zns.n != 1)
      pn = handle_top_level_ambiguities(p, sn);
    else
      pn = sn->zns.v[0]->pn;
    pn = commit_tree(p, pn);
    if (!pn) {
      free_parser_working_data(p);
      free_whitespace_parser(p);
      return NULL;
    }
    if (d_verbose_level) {
      printf(
          "%d states %d scans %d shifts %d reductions "
          "%d compares %d ambiguities\n",
          p->states, p->scans, p->shifts, p->reductions, p->compares, p->ambiguities);
      if (p->user.save_parse_tree) {
        if (d_verbose_level > 1)
          xprint_paren(p, pn);
        else
          print_paren(p, pn);
        printf("\n");
      }
    }
    if (p->user.save_parse_tree) {
      ref_pn(pn);
      res = &pn->parse_node;
    } else
      res = NO_DPN;
    unref_sn(p, p->accept);
    p->accept = NULL;
  } else {
    if (p->accept) {
      unref_sn(p, p->accept);
      p->accept = NULL;
    }
  }
  free_parser_working_data(p);
  free_whitespace_parser(p);
  return res;
}